

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O1

void Acb_NtkCollectNewTfi2_rec(Acb_Ntk_t *p,int iObj,Vec_Int_t *vTfiNew)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  if ((-1 < iObj) && (iObj < (p->vObjTrav).nSize)) {
    piVar3 = (p->vObjTrav).pArray;
    iVar1 = piVar3[(uint)iObj];
    iVar2 = p->nObjTravs;
    piVar3[(uint)iObj] = iVar2;
    if (iVar1 == iVar2) {
      return;
    }
    if (iVar1 == iVar2 + -1) {
      if (iObj == 0) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                      ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
      }
      if ((p->vObjType).nSize <= iObj) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      if ((p->vObjType).pArray[(uint)iObj] != '\x03') {
        if ((p->vObjFans).nSize <= iObj) goto LAB_003a33da;
        iVar1 = (p->vObjFans).pArray[(uint)iObj];
        lVar5 = (long)iVar1;
        if ((lVar5 < 0) || ((p->vFanSto).nSize <= iVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        piVar3 = (p->vFanSto).pArray;
        if (0 < piVar3[lVar5]) {
          lVar6 = 0;
          do {
            lVar4 = lVar6 + 1;
            lVar6 = lVar6 + 1;
            Acb_NtkCollectNewTfi2_rec(p,piVar3[lVar5 + lVar4],vTfiNew);
          } while (lVar6 < piVar3[lVar5]);
        }
      }
    }
    Vec_IntPush(vTfiNew,iObj);
    return;
  }
LAB_003a33da:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Acb_NtkCollectNewTfi2_rec( Acb_Ntk_t * p, int iObj, Vec_Int_t * vTfiNew )
{
    int i, iFanin, * pFanins;
    int fTravIdPrev = Acb_ObjIsTravIdPrev(p, iObj);
    if ( Acb_ObjSetTravIdCur(p, iObj) )
        return;
    if ( fTravIdPrev && !Acb_ObjIsCi(p, iObj) )
        Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, i )
            Acb_NtkCollectNewTfi2_rec( p, iFanin, vTfiNew );
    Vec_IntPush( vTfiNew, iObj );
}